

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

ZSTD_DCtx * ZSTD_initStaticDCtx(void *workspace,size_t workspaceSize)

{
  if (workspaceSize < 0x176e0 || ((ulong)workspace & 7) != 0) {
    workspace = (ZSTD_DCtx *)0x0;
  }
  else {
    *(undefined8 *)((long)workspace + 0x74d8) = 0;
    *(undefined8 *)((long)workspace + 0x75f4) = 0;
    *(undefined8 *)((long)workspace + 0x7640) = 0;
    *(undefined4 *)((long)workspace + 0x7610) = 0;
    *(undefined4 *)((long)workspace + 0x7664) = 0;
    *(undefined8 *)((long)workspace + 0x176d0) = 0;
    *(undefined8 *)((long)workspace + 0x7600) = 0;
    *(undefined8 *)((long)workspace + 0x75d8) = 0;
    *(undefined8 *)((long)workspace + 0x75e0) = 0;
    *(undefined8 *)((long)workspace + 0x75e8) = 0;
    *(undefined8 *)((long)workspace + 0x7618) = 0;
    *(undefined8 *)((long)workspace + 0x7620) = 0;
    ZSTD_DCtx_resetParameters((ZSTD_DCtx *)workspace);
    *(size_t *)((long)workspace + 0x75d8) = workspaceSize;
    *(long *)((long)workspace + 0x7618) = (long)workspace + 0x176e0;
  }
  return (ZSTD_DCtx *)workspace;
}

Assistant:

ZSTD_DCtx* ZSTD_initStaticDCtx(void *workspace, size_t workspaceSize)
{
    ZSTD_DCtx* const dctx = (ZSTD_DCtx*) workspace;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */
    if (workspaceSize < sizeof(ZSTD_DCtx)) return NULL;  /* minimum size */

    ZSTD_initDCtx_internal(dctx);
    dctx->staticSize = workspaceSize;
    dctx->inBuff = (char*)(dctx+1);
    return dctx;
}